

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::set_size
          (RepeatedField<unsigned_int> *this,bool is_soo,int size)

{
  uint uVar1;
  int iVar2;
  void *ptr;
  RepeatedField<unsigned_long> *this_00;
  undefined7 in_register_00000031;
  undefined1 *puVar3;
  LongSooRep *this_01;
  SooRep *this_02;
  Arena *this_03;
  SooRep *unaff_R14;
  Arena *pAStack_70;
  ulong uStack_68;
  SooRep *pSStack_60;
  undefined1 auStack_28 [8];
  code *pcStack_20;
  
  iVar2 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (size <= iVar2) {
    internal::SooRep::set_size(&this->soo_rep_,is_soo,size);
    return;
  }
  this_01 = (LongSooRep *)(ulong)(uint)size;
  pcStack_20 = RepeatedField<unsigned_long>::elements;
  set_size();
  uVar1 = 1;
  if (iVar2 == 0) {
    uVar1 = this_01->capacity;
  }
  if (0 < (int)uVar1) {
    if ((char)iVar2 != '\0') {
      return;
    }
    internal::LongSooRep::elements(this_01);
    return;
  }
  puVar3 = auStack_28;
  this_02 = (SooRep *)(ulong)uVar1;
  RepeatedField<unsigned_long>::elements();
  if ((int)puVar3 < 0) {
    pSStack_60 = (SooRep *)0x1458cc;
    RepeatedField<unsigned_long>::Mutable();
  }
  else {
    pSStack_60 = (SooRep *)0x14589c;
    iVar2 = internal::SooRep::size
                      (this_02,(undefined1  [16])
                               ((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    unaff_R14 = this_02;
    if ((int)puVar3 < iVar2) {
      pSStack_60 = (SooRep *)0x1458b2;
      RepeatedField<unsigned_long>::elements
                ((RepeatedField<unsigned_long> *)this_02,
                 (undefined1  [16])((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  this_03 = (Arena *)((ulong)puVar3 & 0xffffffff);
  pSStack_60 = (SooRep *)
               Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>;
  RepeatedField<unsigned_long>::Mutable();
  uStack_68 = (ulong)puVar3 & 0xffffffff;
  pSStack_60 = unaff_R14;
  if (this_03 == (Arena *)0x0) {
    this_00 = (RepeatedField<unsigned_long> *)operator_new(0x10);
    RepeatedField<unsigned_long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_03,0x10);
    pAStack_70 = this_03;
    Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_70);
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }